

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O2

exr_result_t
exr_get_level_sizes(exr_const_context_t_conflict ctxt,int part_index,int levelx,int levely,
                   int32_t *levw,int32_t *levh)

{
  exr_priv_part_t p_Var1;
  exr_result_t eVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  exr_result_t eStack_40;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar2;
  }
  p_Var1 = ctxt->parts[(uint)part_index];
  if ((p_Var1->storage_mode | EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_DEEP_TILED) {
    if ((((p_Var1->tiles == (exr_attribute_t *)0x0) || (p_Var1->num_tile_levels_x < 1)) ||
        (p_Var1->num_tile_levels_y < 1)) ||
       ((p_Var1->tile_level_tile_count_x == (int32_t *)0x0 ||
        (p_Var1->tile_level_tile_count_y == (int32_t *)0x0)))) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->print_error)(ctxt,0xd,"Tile data missing or corrupt",ctxt->print_error);
      return eVar2;
    }
    if ((levelx < p_Var1->num_tile_levels_x && -1 < (levely | levelx)) &&
        levely < p_Var1->num_tile_levels_y) {
      if (levw != (int32_t *)0x0) {
        *levw = p_Var1->tile_level_tile_size_x[(uint)levelx];
      }
      if (levh != (int32_t *)0x0) {
        *levh = p_Var1->tile_level_tile_size_y[(uint)levely];
      }
      if (ctxt->mode != '\x01') {
        return 0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      return 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStack_40 = 4;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStack_40 = 0x13;
  }
  eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStack_40);
  return eVar2;
}

Assistant:

exr_result_t
exr_get_level_sizes (
    exr_const_context_t ctxt,
    int                 part_index,
    int                 levelx,
    int                 levely,
    int32_t*            levw,
    int32_t*            levh)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (!part->tiles || part->num_tile_levels_x <= 0 ||
            part->num_tile_levels_y <= 0 || !part->tile_level_tile_count_x ||
            !part->tile_level_tile_count_y)
        {
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Tile data missing or corrupt"));
        }

        if (levelx < 0 || levely < 0 || levelx >= part->num_tile_levels_x ||
            levely >= part->num_tile_levels_y)
            return EXR_UNLOCK_WRITE_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_ARGUMENT_OUT_OF_RANGE));

        if (levw) *levw = part->tile_level_tile_size_x[levelx];
        if (levh) *levh = part->tile_level_tile_size_y[levely];
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }

    return EXR_UNLOCK_WRITE_AND_RETURN (
        ctxt->standard_error (ctxt, EXR_ERR_TILE_SCAN_MIXEDAPI));
}